

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O3

void __thiscall TPZIntTriang::SetOrder(TPZIntTriang *this,TPZVec<int> *ord,int type)

{
  uint uVar1;
  uint *puVar2;
  TPZIntRuleT *pTVar3;
  uint uVar4;
  uint order;
  
  puVar2 = (uint *)ord->fStore;
  uVar4 = *puVar2;
  this->fOrdKsi = uVar4;
  uVar1 = puVar2[1];
  order = uVar4;
  if ((int)uVar4 < (int)uVar1) {
    this->fOrdKsi = uVar1;
    uVar4 = *puVar2;
    order = uVar1;
  }
  if ((0x15 < uVar4) || (0x15 < puVar2[1])) {
    this->fOrdKsi = 0x15;
    order = 0x15;
  }
  pTVar3 = TPZIntRuleList::GetRuleT(&TPZIntRuleList::gIntRuleList,order);
  this->fIntKsi = pTVar3;
  this->fOrdKsi = pTVar3->fOrder;
  return;
}

Assistant:

void TPZIntTriang::SetOrder(TPZVec<int> &ord,int type) {
#ifdef PZDEBUG
    if (type != 0) {
        DebugStop();
    }
#endif
	fOrdKsi = ord[0];
	if(ord[1] > ord[0]) fOrdKsi = ord[1];
	if(ord[0] < 0 || ord[0] > TPZIntRuleT::NRULESTRIANGLE_ORDER || ord[1] < 0 || ord[1] > TPZIntRuleT::NRULESTRIANGLE_ORDER) 
	{
#ifdef PZDEBUG
#ifdef PZ_LOG
		LOGPZ_WARN(logger,"Integration rule for triangle - Order is bigger than NRULESTRIANGLE_ORDER (Max)");
#endif
#endif
		
		fOrdKsi = TPZIntRuleT::NRULESTRIANGLE_ORDER;//havendo erro assume a maxima ordem
	}
	fIntKsi = TPZIntRuleList::gIntRuleList.GetRuleT(fOrdKsi);
    fOrdKsi = fIntKsi->Order();
}